

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

bool anon_unknown.dwarf_e4ae9::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  float *pfVar1;
  ulong uVar2;
  char cVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  uint uVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  long local_68;
  ulong local_60;
  
  bVar13 = height < 1;
  if (0 < height) {
    lVar6 = 0;
    local_68 = 0;
    local_60 = 0;
    bVar13 = false;
    do {
      if (0 < width) {
        bVar11 = false;
        uVar10 = 0;
        do {
          iVar12 = ((int)uVar10 + (int)lVar6) % 0x801;
          fVar14 = (float)iVar12;
          fVar8 = ABS(fVar14);
          uVar7 = (uint)fVar14 >> 0x10 & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | uVar9 >> (0x7eU - cVar3 & 0x1f),
               0x80000000 < uVar9 << (cVar3 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | uVar9 | (uint)(uVar9 == 0);
            }
          }
          fVar8 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(uint16_t *)
                                    ((long)&ph->_data[uVar10]._h + ph->_sizeY * local_68) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar7 & 0xffff) * 4);
          if ((fVar8 != *pfVar1) || (NAN(fVar8) || NAN(*pfVar1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&ph->_data[uVar10]._h + ph->_sizeY * local_68
                                                ));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar12);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar11) {
              return bVar13;
            }
            break;
          }
          uVar2 = uVar10 + 1;
          bVar11 = (long)(width + -1) <= (long)uVar10;
          uVar10 = uVar2;
        } while ((uint)width != uVar2);
      }
      bVar13 = height - 1 <= local_60;
      local_60 = local_60 + 1;
      local_68 = local_68 + 2;
      lVar6 = lVar6 + (ulong)(uint)width;
    } while (local_60 != (uint)height);
  }
  return bVar13;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}